

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O0

void __thiscall QAbstractSocketPrivate::resetSocketLayer(QAbstractSocketPrivate *this)

{
  QObject *in_RDI;
  QObject *unaff_retaddr;
  char *in_stack_ffffffffffffffe8;
  QObject *signal;
  
  in_RDI[0x249] = (QObject)0x0;
  if (*(long *)(in_RDI + 0x208) != 0) {
    signal = in_RDI;
    (**(code **)(**(long **)(in_RDI + 0x208) + 0xa8))();
    QObject::disconnect(unaff_retaddr,(char *)signal,in_RDI,in_stack_ffffffffffffffe8);
    if (*(long **)(in_RDI + 0x208) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x208) + 0x20))();
    }
    *(undefined8 *)(in_RDI + 0x208) = 0;
    *(undefined8 *)(in_RDI + 0x210) = 0xffffffffffffffff;
  }
  if (*(long *)(in_RDI + 0x250) != 0) {
    QTimer::stop();
  }
  return;
}

Assistant:

void QAbstractSocketPrivate::resetSocketLayer()
{
#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocketPrivate::resetSocketLayer()");
#endif

    hasPendingData = false;
    if (socketEngine) {
        socketEngine->close();
        socketEngine->disconnect();
        delete socketEngine;
        socketEngine = nullptr;
        cachedSocketDescriptor = -1;
    }
    if (connectTimer)
        connectTimer->stop();
}